

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall
amrex::Amr::grid_places
          (Amr *this,int lbase,Real time,int *new_finest,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *new_grids)

{
  size_type sVar1;
  long *plVar2;
  bool bVar3;
  void *pvVar4;
  int iVar5;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  Box bx;
  BoxList bl;
  Box local_1dc;
  double local_1c0;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [8];
  undefined8 auStack_1a0 [46];
  int iVar6;
  
  local_1c0 = second();
  if (lbase == 0) {
    AmrMesh::MakeBaseGrids((BoxArray *)local_1b8,(AmrMesh *)this);
    BoxArray::operator=((new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
                        .super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start,(BoxArray *)local_1b8);
    BoxArray::~BoxArray((BoxArray *)local_1b8);
  }
  sVar1 = (this->initial_grids_file)._M_string_length;
  if (sVar1 == 0 || time != 0.0) {
    if (sVar1 != 0) goto LAB_005b2ac0;
  }
  else {
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids == false) {
      iVar5 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      iVar7 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
      if (iVar5 <= iVar7) {
        iVar7 = iVar5;
      }
      iVar6 = (int)((ulong)(DAT_008177b8 - initial_ba) >> 3);
      iVar5 = iVar6 * -0x3b13b13b;
      if (SBORROW4(iVar7,iVar5) == iVar7 + iVar6 * 0x3b13b13b < 0) {
        iVar7 = iVar5;
      }
      *new_finest = iVar7;
      if (iVar7 < 1) {
        return;
      }
      lVar12 = 1;
      do {
        BoxList::BoxList((BoxList *)local_1b8);
        plVar2 = *(long **)(lVar12 * 0x68 + -0x20 + initial_ba);
        uVar8 = (int)(plVar2[1] - *plVar2 >> 2) * -0x49249249;
        if (0 < (int)uVar8) {
          uVar9 = (ulong)(uVar8 & 0x7fffffff);
          lVar13 = (lVar12 + -1) * 0x68;
          lVar11 = 0;
          do {
            BATransformer::operator()
                      (&local_1dc,(BATransformer *)(initial_ba + lVar13),
                       (Box *)(**(long **)(initial_ba + 0x48 + lVar13) + lVar11));
            if (lbase < lVar12) {
              if ((ostringstream  [8])local_1b8._8_8_ == local_1a8) {
                std::vector<amrex::Box,std::allocator<amrex::Box>>::
                _M_realloc_insert<amrex::Box_const&>
                          ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_1b8,
                           (iterator)local_1b8._8_8_,&local_1dc);
              }
              else {
                *(ulong *)((IntVect *)(local_1b8._8_8_ + 0xc))->vect =
                     CONCAT44(local_1dc.bigend.vect[1],local_1dc.bigend.vect[0]);
                *(undefined8 *)(local_1b8._8_8_ + 0x14) = local_1dc._20_8_;
                *(ulong *)local_1b8._8_8_ =
                     CONCAT71(local_1dc.smallend.vect._1_7_,(undefined1)local_1dc.smallend.vect[0]);
                *(ulong *)(local_1b8._8_8_ + 8) =
                     CONCAT44(local_1dc.bigend.vect[0],local_1dc.smallend.vect[2]);
                local_1b8._8_8_ = local_1b8._8_8_ + 0x1c;
              }
            }
            lVar11 = lVar11 + 0x1c;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        if (lbase < lVar12) {
          BoxArray::define((new_grids->
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar12,(BoxList *)local_1b8);
        }
        pvVar4 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,(long)local_1a8 - (long)pvVar4);
        }
        bVar3 = lVar12 < *new_finest;
        lVar12 = lVar12 + 1;
      } while (bVar3);
      return;
    }
LAB_005b2ac0:
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids == true) {
      iVar5 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      iVar7 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
      if (iVar5 <= iVar7) {
        iVar7 = iVar5;
      }
      iVar6 = (int)((ulong)(DAT_008177b8 - initial_ba) >> 3);
      iVar5 = iVar6 * -0x3b13b13b;
      if (SBORROW4(iVar7,iVar5) == iVar7 + iVar6 * 0x3b13b13b < 0) {
        iVar7 = iVar5;
      }
      *new_finest = iVar7;
      if (lbase < iVar7) {
        lVar11 = (long)lbase;
        lVar12 = lVar11;
        do {
          BoxList::BoxList((BoxList *)local_1b8);
          lVar13 = lVar12 * 0x68;
          plVar2 = *(long **)(initial_ba + 0x48 + lVar13);
          uVar8 = (int)(plVar2[1] - *plVar2 >> 2) * -0x49249249;
          if (0 < (int)uVar8) {
            uVar9 = (ulong)(uVar8 & 0x7fffffff);
            lVar10 = 0;
            do {
              BATransformer::operator()
                        (&local_1dc,(BATransformer *)(initial_ba + lVar13),
                         (Box *)(**(long **)(initial_ba + 0x48 + lVar13) + lVar10));
              if (lVar11 <= lVar12) {
                if ((ostringstream  [8])local_1b8._8_8_ == local_1a8) {
                  std::vector<amrex::Box,std::allocator<amrex::Box>>::
                  _M_realloc_insert<amrex::Box_const&>
                            ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_1b8,
                             (iterator)local_1b8._8_8_,&local_1dc);
                }
                else {
                  *(ulong *)((IntVect *)(local_1b8._8_8_ + 0xc))->vect =
                       CONCAT44(local_1dc.bigend.vect[1],local_1dc.bigend.vect[0]);
                  *(undefined8 *)(local_1b8._8_8_ + 0x14) = local_1dc._20_8_;
                  *(ulong *)local_1b8._8_8_ =
                       CONCAT71(local_1dc.smallend.vect._1_7_,(undefined1)local_1dc.smallend.vect[0]
                               );
                  *(ulong *)(local_1b8._8_8_ + 8) =
                       CONCAT44(local_1dc.bigend.vect[0],local_1dc.smallend.vect[2]);
                  local_1b8._8_8_ = local_1b8._8_8_ + 0x1c;
                }
              }
              lVar10 = lVar10 + 0x1c;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          lVar13 = lVar12 + 1;
          if (lVar11 <= lVar12) {
            BoxArray::define((new_grids->
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar13,(BoxList *)local_1b8)
            ;
          }
          BoxArray::maxSize((new_grids->
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar13,
                            (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar13);
          pvVar4 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
          if (pvVar4 != (void *)0x0) {
            operator_delete(pvVar4,(long)local_1a8 - (long)pvVar4);
          }
          lVar12 = lVar13;
        } while (lVar13 < *new_finest);
      }
      goto LAB_005b2d96;
    }
  }
  if ((this->regrid_grids_file)._M_string_length != 0) {
    iVar5 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    iVar7 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1;
    if (iVar5 <= iVar7) {
      iVar7 = iVar5;
    }
    iVar6 = (int)((ulong)(DAT_008177d0 - regrid_ba) >> 3);
    iVar5 = iVar6 * -0x3b13b13b;
    if (SBORROW4(iVar7,iVar5) == iVar7 + iVar6 * 0x3b13b13b < 0) {
      iVar7 = iVar5;
    }
    *new_finest = iVar7;
    if (iVar7 < 1) {
      return;
    }
    lVar12 = 1;
    do {
      BoxList::BoxList((BoxList *)local_1b8);
      plVar2 = *(long **)(lVar12 * 0x68 + -0x20 + regrid_ba);
      uVar8 = (int)(plVar2[1] - *plVar2 >> 2) * -0x49249249;
      if (0 < (int)uVar8) {
        uVar9 = (ulong)(uVar8 & 0x7fffffff);
        lVar13 = (lVar12 + -1) * 0x68;
        lVar11 = 0;
        do {
          BATransformer::operator()
                    (&local_1dc,(BATransformer *)(regrid_ba + lVar13),
                     (Box *)(**(long **)(regrid_ba + 0x48 + lVar13) + lVar11));
          if (lbase < lVar12) {
            if ((ostringstream  [8])local_1b8._8_8_ == local_1a8) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_1b8,
                         (iterator)local_1b8._8_8_,&local_1dc);
            }
            else {
              *(ulong *)((IntVect *)(local_1b8._8_8_ + 0xc))->vect =
                   CONCAT44(local_1dc.bigend.vect[1],local_1dc.bigend.vect[0]);
              *(undefined8 *)(local_1b8._8_8_ + 0x14) = local_1dc._20_8_;
              *(ulong *)local_1b8._8_8_ =
                   CONCAT71(local_1dc.smallend.vect._1_7_,(undefined1)local_1dc.smallend.vect[0]);
              *(ulong *)(local_1b8._8_8_ + 8) =
                   CONCAT44(local_1dc.bigend.vect[0],local_1dc.smallend.vect[2]);
              local_1b8._8_8_ = local_1b8._8_8_ + 0x1c;
            }
          }
          lVar11 = lVar11 + 0x1c;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      if (lbase < lVar12) {
        BoxArray::define((new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                         ).super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar12,(BoxList *)local_1b8);
      }
      pvVar4 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_1a8 - (long)pvVar4);
      }
      bVar3 = lVar12 < *new_finest;
      lVar12 = lVar12 + 1;
    } while (bVar3);
    return;
  }
LAB_005b2d96:
  AmrMesh::MakeNewGrids((AmrMesh *)this,lbase,time,new_finest,new_grids);
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    dVar14 = second();
    local_1b8._8_8_ = OutStream();
    local_1b8._0_4_ = *(BATType *)(DAT_00816950 + -0x30);
    local_1b8._4_4_ = ((IndexType *)(DAT_00816950 + -0x48))->itype;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    *(undefined8 *)((long)auStack_1a0 + *(long *)((long)local_1a8 + -0x18)) =
         *(undefined8 *)
          ((ostream *)(local_1b8._8_8_ + 8) + *(long *)(*(long *)local_1b8._8_8_ + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"grid_places() time: ",0x14);
    std::ostream::_M_insert<double>(dVar14 - local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," new finest: ",0xd);
    std::ostream::operator<<(local_1a8,*new_finest);
    local_1dc.smallend.vect[0]._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1dc,1);
    Print::~Print((Print *)local_1b8);
  }
  return;
}

Assistant:

void
Amr::grid_places (int              lbase,
                  Real             time,
                  int&             new_finest,
                  Vector<BoxArray>& new_grids)
{
    BL_PROFILE("Amr::grid_places()");

    const auto strttime = amrex::second();

    if (lbase == 0)
    {
        new_grids[0] = MakeBaseGrids();
    }

    if ( time == 0. && !initial_grids_file.empty() && !use_fixed_coarse_grids)
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,initial_ba.size());

        for (int lev = 1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = initial_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(initial_ba[lev-1][i]);
                if (lev > lbase)
                    bl.push_back(bx);
            }
            if (lev > lbase)
                new_grids[lev].define(bl);
        }
        return;
    }

    // Use grids in initial_grids_file as fixed coarse grids.
    if ( ! initial_grids_file.empty() && use_fixed_coarse_grids)
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,initial_ba.size());

        for (int lev = lbase+1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = initial_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(initial_ba[lev-1][i]);

                if (lev > lbase)
                    bl.push_back(bx);

            }
            if (lev > lbase)
                new_grids[lev].define(bl);
            new_grids[lev].maxSize(max_grid_size[lev]);
        }
    }
    else if ( !regrid_grids_file.empty() )     // Use grids in regrid_grids_file
    {
        new_finest = std::min(max_level,(finest_level+1));
        new_finest = std::min<int>(new_finest,regrid_ba.size());
        for (int lev = 1; lev <= new_finest; lev++)
        {
            BoxList bl;
            int ngrid = regrid_ba[lev-1].size();
            for (int i = 0; i < ngrid; i++)
            {
                Box bx(regrid_ba[lev-1][i]);
                if (lev > lbase)
                    bl.push_back(bx);
            }
            if (lev > lbase)
                new_grids[lev].define(bl);
        }
        return;
    }

    MakeNewGrids(lbase, time, new_finest, new_grids);

    if (verbose > 0)
    {
        auto stoptime = amrex::second() - strttime;

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceRealMax(stoptime,ParallelDescriptor::IOProcessorNumber());
            amrex::Print() << "grid_places() time: " << stoptime << " new finest: " << new_finest<< '\n';
#ifdef BL_LAZY
        });
#endif
    }
}